

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

void Cgt_ManDetectFanout(Aig_Man_t *pAig,Aig_Obj_t *pObj,int nOdcMax,Vec_Ptr_t *vFanout)

{
  uint uVar1;
  int iFan;
  void *Entry;
  Aig_Obj_t *pAVar2;
  uint i;
  int i_00;
  uint uVar3;
  
  vFanout->nSize = 0;
  Aig_ManIncrementTravId(pAig);
  Cgt_ManDetectFanout_rec(pAig,pObj,nOdcMax,vFanout);
  iFan = -1;
  i_00 = 0;
  i = 0;
  do {
    if (vFanout->nSize <= i_00) {
      if (vFanout->nSize < (int)i) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      vFanout->nSize = i;
      if (1 < (int)i) {
        qsort(vFanout->pArray,(ulong)i,8,Aig_ObjCompareIdIncrease);
        i = vFanout->nSize;
      }
      if (0 < (int)i) {
        return;
      }
      __assert_fail("Vec_PtrSize(vFanout) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                    ,0x89,"void Cgt_ManDetectFanout(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
    Entry = Vec_PtrEntry(vFanout,i_00);
    if (pAig->pFanData == (int *)0x0) {
      __assert_fail("pAig->pFanData",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                    ,0x80,"void Cgt_ManDetectFanout(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
    for (uVar3 = 0; uVar1 = *(uint *)((long)Entry + 0x18) >> 6, uVar3 < uVar1; uVar3 = uVar3 + 1) {
      if (uVar3 == 0) {
        iFan = Aig_ObjFanout0Int(pAig,*(int *)((long)Entry + 0x24));
      }
      else {
        iFan = Aig_ObjFanoutNext(pAig,iFan);
      }
      pAVar2 = Aig_ManObj(pAig,iFan >> 1);
      if (pAVar2->TravId != pAig->nTravIds) {
        uVar1 = *(uint *)((long)Entry + 0x18) >> 6;
        break;
      }
    }
    if (uVar1 != uVar3) {
      Vec_PtrWriteEntry(vFanout,i,Entry);
      i = i + 1;
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Cgt_ManDetectFanout( Aig_Man_t * pAig, Aig_Obj_t * pObj, int nOdcMax, Vec_Ptr_t * vFanout )
{
    Aig_Obj_t * pFanout;
    int i, k, f, iFanout = -1;
    // collect visited nodes
    Vec_PtrClear( vFanout );
    Aig_ManIncrementTravId( pAig );
    Cgt_ManDetectFanout_rec( pAig, pObj, nOdcMax, vFanout );
    // remove those nodes whose fanout is included
    k = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
    {
        // go through the fanouts of this node
        Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, f )
            if ( !Aig_ObjIsTravIdCurrent(pAig, pFanout) )
                break;
        if ( f == Aig_ObjRefs(pObj) ) // all fanouts are included
            continue;
        Vec_PtrWriteEntry( vFanout, k++, pObj );
    }
    Vec_PtrShrink( vFanout, k );
    Vec_PtrSort( vFanout, (int (*)(void))Aig_ObjCompareIdIncrease );
    assert( Vec_PtrSize(vFanout) > 0 );
}